

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O1

ecs_entity_t
components_contains(ecs_world_t *world,ecs_type_t table_type,ecs_type_t type,
                   ecs_entity_t *entity_out,_Bool match_all)

{
  uint uVar1;
  void *pvVar2;
  long *plVar3;
  ecs_entity_t eVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  ecs_entity_t local_60;
  
  uVar1 = ecs_vector_count(table_type);
  pvVar2 = _ecs_vector_first(table_type,8,0x10);
  if (0 < (int)uVar1) {
    uVar6 = 0;
    do {
      uVar5 = *(ulong *)((long)pvVar2 + uVar6 * 8);
      bVar7 = true;
      if ((char)(uVar5 >> 0x38) == -3) {
        uVar5 = uVar5 & 0xffffffffffffff;
        plVar3 = (long *)_ecs_sparse_get_sparse((world->store).entity_index,0x10,uVar5);
        _ecs_assert(plVar3 != (long *)0x0,0xc,(char *)0x0,"record != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                    ,0x1d);
        if (plVar3 == (long *)0x0) {
          __assert_fail("record != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/query.c"
                        ,0x1d,
                        "ecs_entity_t components_contains(ecs_world_t *, ecs_type_t, ecs_type_t, ecs_entity_t *, _Bool)"
                       );
        }
        if ((undefined8 *)*plVar3 != (undefined8 *)0x0) {
          eVar4 = ecs_type_contains(world,*(ecs_type_t *)*plVar3,type,match_all,true);
          bVar7 = eVar4 == 0;
          if (!bVar7) {
            local_60 = eVar4;
          }
          if (entity_out != (ecs_entity_t *)0x0 && !bVar7) {
            *entity_out = uVar5;
            local_60 = eVar4;
          }
        }
      }
      if (!bVar7) {
        return local_60;
      }
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
  }
  return 0;
}

Assistant:

static
ecs_entity_t components_contains(
    ecs_world_t *world,
    ecs_type_t table_type,
    ecs_type_t type,
    ecs_entity_t *entity_out,
    bool match_all)
{
    ecs_vector_each(table_type, ecs_entity_t, c_ptr, {
        ecs_entity_t entity = *c_ptr;

        if (ECS_HAS_ROLE(entity, CHILDOF)) {
            entity &= ECS_COMPONENT_MASK;

            ecs_record_t *record = ecs_eis_get(world, entity);
            ecs_assert(record != 0, ECS_INTERNAL_ERROR, NULL);

            if (record->table) {
                ecs_entity_t component = ecs_type_contains(
                    world, record->table->type, type, match_all, true);

                if (component) {
                    if (entity_out) *entity_out = entity;
                    return component;
                }
            }
        }
    });

    return 0;
}